

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void __thiscall
Js::DynamicProfileInfo::Initialize(DynamicProfileInfo *this,FunctionBody *functionBody)

{
  bool bVar1;
  ProfileId PVar2;
  ArgSlot AVar3;
  uint uVar4;
  BVFixed *pBVar5;
  CallSiteInfo **ppCVar6;
  LdLenInfo **ppLVar7;
  LdElemInfo **ppLVar8;
  StElemInfo **ppSVar9;
  FldInfo **ppFVar10;
  ValueType **ppVVar11;
  ArrayCallSiteInfo **ppAVar12;
  ScriptContext *this_00;
  ThreadContext *this_01;
  ushort local_42;
  ushort local_40;
  ushort local_3e;
  ushort local_3c;
  ProfileId i_13;
  ProfileId i_12;
  ProfileId i_11;
  ArgSlot i_10;
  ProfileId i_9;
  ProfileId i_8;
  ProfileId i_7;
  uint i_6;
  ushort local_28;
  ProfileId i_5;
  ProfileId i_4;
  ProfileId i_3;
  ProfileId i_2;
  ProfileId i_1;
  uint i;
  LoopFlags defaultValues;
  FunctionBody *pFStack_18;
  BVIndex loopFlagsCount;
  FunctionBody *functionBody_local;
  DynamicProfileInfo *this_local;
  
  (this->thisInfo).valueType.field_0.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::Uninitialized.field_0;
  pFStack_18 = functionBody;
  uVar4 = FunctionBody::GetLoopCount(functionBody);
  i = uVar4 << 1;
  if (i != 0) {
    pBVar5 = Memory::WriteBarrierPtr<BVFixed>::operator->(&this->loopFlags);
    BVFixed::Init(pBVar5,i);
    LoopFlags::LoopFlags((LoopFlags *)((long)&i_1 + 1));
    for (_i_4 = 0; uVar4 = FunctionBody::GetLoopCount(pFStack_18), _i_4 < uVar4; _i_4 = _i_4 + 1) {
      pBVar5 = Memory::WriteBarrierPtr<BVFixed>::operator->(&this->loopFlags);
      BVFixed::SetRange<Js::LoopFlags>(pBVar5,(LoopFlags *)((long)&i_1 + 1),_i_4 << 1,2);
    }
  }
  for (i_5 = 0; PVar2 = FunctionBody::GetProfiledCallSiteCount(pFStack_18), i_5 < PVar2;
      i_5 = i_5 + 1) {
    ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                        ((WriteBarrierPtr *)&this->callSiteInfo);
    ((anon_union_2_4_ea848c7b_for_ValueType_13 *)(*ppCVar6 + i_5))->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::Uninitialized.field_0;
    ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                        ((WriteBarrierPtr *)&this->callSiteInfo);
    (*ppCVar6)[i_5].u.functionData.sourceId = 0xffffffff;
  }
  for (local_28 = 0; PVar2 = FunctionBody::GetProfiledCallApplyCallSiteCount(pFStack_18),
      local_28 < PVar2; local_28 = local_28 + 1) {
    ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                        ((WriteBarrierPtr *)&this->callApplyTargetInfo);
    ((anon_union_2_4_ea848c7b_for_ValueType_13 *)(*ppCVar6 + local_28))->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::Uninitialized.field_0;
    ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                        ((WriteBarrierPtr *)&this->callApplyTargetInfo);
    (*ppCVar6)[local_28].u.functionData.sourceId = 0xffffffff;
  }
  for (i_6._2_2_ = 0; PVar2 = FunctionBody::GetProfiledLdLenCount(pFStack_18), i_6._2_2_ < PVar2;
      i_6._2_2_ = i_6._2_2_ + 1) {
    ppLVar7 = Memory::WriteBarrierPtr::operator_cast_to_LdLenInfo__
                        ((WriteBarrierPtr *)&this->ldLenInfo);
    ((anon_union_2_4_ea848c7b_for_ValueType_13 *)(*ppLVar7 + i_6._2_2_))->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::Uninitialized.field_0;
  }
  for (i_6._0_2_ = 0; PVar2 = FunctionBody::GetProfiledLdElemCount(pFStack_18), (ushort)i_6 < PVar2;
      i_6._0_2_ = (ushort)i_6 + 1) {
    ppLVar8 = Memory::WriteBarrierPtr::operator_cast_to_LdElemInfo__
                        ((WriteBarrierPtr *)&this->ldElemInfo);
    ((anon_union_2_4_ea848c7b_for_ValueType_13 *)(*ppLVar8 + (ushort)i_6))->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::Uninitialized.field_0;
    ppLVar8 = Memory::WriteBarrierPtr::operator_cast_to_LdElemInfo__
                        ((WriteBarrierPtr *)&this->ldElemInfo);
    (*ppLVar8)[(ushort)i_6].elemType.field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::Uninitialized.field_0;
    ppLVar8 = Memory::WriteBarrierPtr::operator_cast_to_LdElemInfo__
                        ((WriteBarrierPtr *)&this->ldElemInfo);
    (*ppLVar8)[(ushort)i_6].flags = FldInfo_NoInfo;
  }
  for (i_7 = 0; PVar2 = FunctionBody::GetProfiledStElemCount(pFStack_18), i_7 < PVar2; i_7 = i_7 + 1
      ) {
    ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_StElemInfo__
                        ((WriteBarrierPtr *)&this->stElemInfo);
    ((anon_union_2_4_ea848c7b_for_ValueType_13 *)(*ppSVar9 + i_7))->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::Uninitialized.field_0;
    ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_StElemInfo__
                        ((WriteBarrierPtr *)&this->stElemInfo);
    (*ppSVar9)[i_7].flags = FldInfo_NoInfo;
  }
  for (_i_10 = 0; uVar4 = FunctionBody::GetProfiledFldCount(pFStack_18), _i_10 < uVar4;
      _i_10 = _i_10 + 1) {
    ppFVar10 = Memory::WriteBarrierPtr::operator_cast_to_FldInfo__
                         ((WriteBarrierPtr *)&this->fldInfo);
    (*ppFVar10)[_i_10].flags = FldInfo_NoInfo;
    ppFVar10 = Memory::WriteBarrierPtr::operator_cast_to_FldInfo__
                         ((WriteBarrierPtr *)&this->fldInfo);
    ((anon_union_2_4_ea848c7b_for_ValueType_13 *)(*ppFVar10 + _i_10))->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::Uninitialized.field_0;
    ppFVar10 = Memory::WriteBarrierPtr::operator_cast_to_FldInfo__
                         ((WriteBarrierPtr *)&this->fldInfo);
    (*ppFVar10)[_i_10].polymorphicInlineCacheUtilization = 0x80;
  }
  for (i_11 = 0; PVar2 = FunctionBody::GetProfiledDivOrRemCount(pFStack_18), i_11 < PVar2;
      i_11 = i_11 + 1) {
    ppVVar11 = Memory::WriteBarrierPtr::operator_cast_to_ValueType__
                         ((WriteBarrierPtr *)&this->divideTypeInfo);
    (*ppVVar11)[i_11].field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::Uninitialized.field_0;
  }
  for (i_12 = 0; PVar2 = FunctionBody::GetProfiledSwitchCount(pFStack_18), i_12 < PVar2;
      i_12 = i_12 + 1) {
    ppVVar11 = Memory::WriteBarrierPtr::operator_cast_to_ValueType__
                         ((WriteBarrierPtr *)&this->switchTypeInfo);
    (*ppVVar11)[i_12].field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::Uninitialized.field_0;
  }
  for (i_13 = 0; PVar2 = FunctionBody::GetProfiledSlotCount(pFStack_18), i_13 < PVar2;
      i_13 = i_13 + 1) {
    ppVVar11 = Memory::WriteBarrierPtr::operator_cast_to_ValueType__
                         ((WriteBarrierPtr *)&this->slotInfo);
    (*ppVVar11)[i_13].field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::Uninitialized.field_0;
  }
  for (local_3c = 0; AVar3 = FunctionBody::GetProfiledInParamsCount(pFStack_18), local_3c < AVar3;
      local_3c = local_3c + 1) {
    ppVVar11 = Memory::WriteBarrierPtr::operator_cast_to_ValueType__
                         ((WriteBarrierPtr *)&this->parameterInfo);
    (*ppVVar11)[local_3c].field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::Uninitialized.field_0;
  }
  for (local_3e = 0; PVar2 = FunctionBody::GetProfiledReturnTypeCount(pFStack_18), local_3e < PVar2;
      local_3e = local_3e + 1) {
    ppVVar11 = Memory::WriteBarrierPtr::operator_cast_to_ValueType__
                         ((WriteBarrierPtr *)&this->returnTypeInfo);
    (*ppVVar11)[local_3e].field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::Uninitialized.field_0;
  }
  this->rejitCount = 0;
  this->bailOutOffsetForLastRejit = 0xffffffff;
  for (local_40 = 0; PVar2 = FunctionBody::GetProfiledArrayCallSiteCount(pFStack_18),
      local_40 < PVar2; local_40 = local_40 + 1) {
    uVar4 = FunctionProxy::GetFunctionNumber((FunctionProxy *)pFStack_18);
    ppAVar12 = Memory::WriteBarrierPtr::operator_cast_to_ArrayCallSiteInfo__
                         ((WriteBarrierPtr *)&this->arrayCallSiteInfo);
    (*ppAVar12)[local_40].functionNumber = uVar4;
    ppAVar12 = Memory::WriteBarrierPtr::operator_cast_to_ArrayCallSiteInfo__
                         ((WriteBarrierPtr *)&this->arrayCallSiteInfo);
    (*ppAVar12)[local_40].callSiteNumber = local_40;
  }
  this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)pFStack_18);
  this_01 = ScriptContext::GetThreadContext(this_00);
  bVar1 = ThreadContext::IsRuntimeInTTDMode(this_01);
  if (bVar1) {
    for (local_42 = 0; PVar2 = FunctionBody::GetProfiledArrayCallSiteCount(pFStack_18),
        local_42 < PVar2; local_42 = local_42 + 1) {
      ppAVar12 = Memory::WriteBarrierPtr::operator_cast_to_ArrayCallSiteInfo__
                           ((WriteBarrierPtr *)&this->arrayCallSiteInfo);
      ArrayCallSiteInfo::SetIsNotNativeArray(*ppAVar12 + local_42);
    }
  }
  return;
}

Assistant:

void DynamicProfileInfo::Initialize(FunctionBody *const functionBody)
    {
        // Need to make value types uninitialized, which is not equivalent to zero
        thisInfo.valueType = ValueType::Uninitialized;
        const BVIndex loopFlagsCount = functionBody->GetLoopCount() * LoopFlags::COUNT;
        if (loopFlagsCount)
        {
            this->loopFlags->Init(loopFlagsCount);
            LoopFlags defaultValues;
            for (uint i = 0; i < functionBody->GetLoopCount(); ++i)
            {
                this->loopFlags->SetRange(&defaultValues, i * LoopFlags::COUNT, LoopFlags::COUNT);
            }
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledCallSiteCount(); ++i)
        {
            callSiteInfo[i].returnType = ValueType::Uninitialized;
            callSiteInfo[i].u.functionData.sourceId = NoSourceId;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledCallApplyCallSiteCount(); ++i)
        {
            callApplyTargetInfo[i].returnType = ValueType::Uninitialized;
            callApplyTargetInfo[i].u.functionData.sourceId = NoSourceId;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledLdLenCount(); ++i)
        {
            ldLenInfo[i].arrayType = ValueType::Uninitialized;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledLdElemCount(); ++i)
        {
            ldElemInfo[i].arrayType = ValueType::Uninitialized;
            ldElemInfo[i].elemType = ValueType::Uninitialized;
            ldElemInfo[i].flags = Js::FldInfo_NoInfo;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledStElemCount(); ++i)
        {
            stElemInfo[i].arrayType = ValueType::Uninitialized;
            stElemInfo[i].flags = Js::FldInfo_NoInfo;
        }
        for (uint i = 0; i < functionBody->GetProfiledFldCount(); ++i)
        {
            fldInfo[i].flags = FldInfo_NoInfo;
            fldInfo[i].valueType = ValueType::Uninitialized;
            fldInfo[i].polymorphicInlineCacheUtilization = PolymorphicInlineCacheUtilizationThreshold;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledDivOrRemCount(); ++i)
        {
            divideTypeInfo[i] = ValueType::Uninitialized;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledSwitchCount(); ++i)
        {
            switchTypeInfo[i] = ValueType::Uninitialized;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledSlotCount(); ++i)
        {
            slotInfo[i] = ValueType::Uninitialized;
        }
        for (ArgSlot i = 0; i < functionBody->GetProfiledInParamsCount(); ++i)
        {
            parameterInfo[i] = ValueType::Uninitialized;
        }
        for (ProfileId i = 0; i < functionBody->GetProfiledReturnTypeCount(); ++i)
        {
            returnTypeInfo[i] = ValueType::Uninitialized;
        }

        this->rejitCount = 0;
        this->bailOutOffsetForLastRejit = Js::Constants::NoByteCodeOffset;
#if DBG
        for (ProfileId i = 0; i < functionBody->GetProfiledArrayCallSiteCount(); ++i)
        {
            arrayCallSiteInfo[i].functionNumber = functionBody->GetFunctionNumber();
            arrayCallSiteInfo[i].callSiteNumber = i;
        }
#endif

#if TTD_NATIVE_PROFILE_ARRAY_WORK_AROUND
        if(functionBody->GetScriptContext()->GetThreadContext()->IsRuntimeInTTDMode())
        {
            for(ProfileId i = 0; i < functionBody->GetProfiledArrayCallSiteCount(); ++i)
            {
                arrayCallSiteInfo[i].SetIsNotNativeArray();
            }
        }
#endif
    }